

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves_sort.cpp
# Opt level: O1

void UpdateRootMove(int num_of_all_movements,Movement *all_movements,Movement *move)

{
  UINT32 UVar1;
  long lVar2;
  
  if (0 < num_of_all_movements) {
    UVar1 = move->value;
    lVar2 = 0;
    do {
      if (((move->from == (&all_movements->from)[lVar2]) &&
          (move->to == (&all_movements->to)[lVar2])) &&
         (move->capture == (&all_movements->capture)[lVar2])) {
        move->value = 0x80000000;
        UVar1 = 0x80000000;
      }
      else if (UVar1 != 0) {
        UVar1 = UVar1 - 1;
        move->value = UVar1;
      }
      lVar2 = lVar2 + 0xc;
    } while ((ulong)(uint)num_of_all_movements * 0xc != lVar2);
  }
  return;
}

Assistant:

void UpdateRootMove(int num_of_all_movements, Movement* all_movements, Movement& move){
    for(int i = 0; i < num_of_all_movements; i++){
        if(isMoveEqual(move, all_movements[i])){
            move.value = MAX_MOVE_VALUE;
        }
        else if(move.value){
            move.value--;
        }
    }
}